

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

GeneralMedium<pbrt::NanoVDBMediumProvider> *
pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>::Create
          (NanoVDBMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RGBColorSpace *pRVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ParsedParameter *pPVar5;
  SpectrumHandle SVar6;
  string preset;
  string local_c8;
  Float local_a8;
  Float local_a4;
  undefined1 local_a0 [40];
  SpectrumHandle local_78 [3];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &local_c8.field_2;
  local_78[0].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  local_a0._32_8_ = (ParsedParameter *)0x0;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  local_78[1].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )provider;
  local_78[2].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )renderFromMedium;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"preset","");
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  ParameterDictionary::GetOneString((string *)local_60,parameters,&local_c8,(string *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,
                    (ulong)((long)&(((string *)local_a0._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_60._8_8_ != (ParsedParameter *)0x0) {
    bVar3 = GetMediumScatteringProperties
                      ((string *)local_60,local_78,(SpectrumHandle *)(local_a0 + 0x20),alloc);
    if (!bVar3) {
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_c8,"Material preset \"%s\" not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      Warning(loc,local_c8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  SVar6.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )local_78[0];
  if (local_78[0].
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"sigma_a","");
    local_40._8_8_ = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_a0,(string *)parameters,(SpectrumHandle *)&local_c8,
               (int)&local_40 + 8,(Allocator)0x1);
    SVar6.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )local_a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    pRVar2 = RGBColorSpace::sRGB;
    if (SVar6.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      local_c8._M_dataplus._M_p = (pointer)0x3b1d49523a902de0;
      local_c8._M_string_length = CONCAT44(local_c8._M_string_length._4_4_,0x3c656042);
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      RGBSpectrum::RGBSpectrum((RGBSpectrum *)CONCAT44(extraout_var,iVar4),pRVar2,(RGB *)&local_c8);
      SVar6.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var,iVar4) | 0x4000000000000);
    }
  }
  pPVar5 = (ParsedParameter *)local_a0._32_8_;
  if ((ParsedParameter *)local_a0._32_8_ == (ParsedParameter *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"sigma_s","");
    local_40._M_allocated_capacity = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_a0,(string *)parameters,(SpectrumHandle *)&local_c8,
               (SpectrumType)&local_40,(Allocator)0x1);
    pPVar5 = (ParsedParameter *)local_a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    pRVar2 = RGBColorSpace::sRGB;
    if (pPVar5 == (ParsedParameter *)0x0) {
      local_c8._M_dataplus._M_p = (pointer)0x404d70a440233333;
      local_c8._M_string_length = CONCAT44(local_c8._M_string_length._4_4_,0x407147ae);
      iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,8);
      RGBSpectrum::RGBSpectrum
                ((RGBSpectrum *)CONCAT44(extraout_var_00,iVar4),pRVar2,(RGB *)&local_c8);
      pPVar5 = (ParsedParameter *)(CONCAT44(extraout_var_00,iVar4) | 0x4000000000000);
    }
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"scale","");
  local_a4 = ParameterDictionary::GetOneFloat(parameters,&local_c8,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"g","");
  local_a8 = ParameterDictionary::GetOneFloat(parameters,&local_c8,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  iVar4 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x1a8,8);
  local_c8._M_dataplus._M_p =
       (pointer)SVar6.
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                .bits;
  local_a0._0_8_ = pPVar5;
  GeneralMedium((GeneralMedium<pbrt::NanoVDBMediumProvider> *)CONCAT44(extraout_var_01,iVar4),
                (NanoVDBMediumProvider *)
                local_78[1].
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                .bits,(SpectrumHandle *)&local_c8,(SpectrumHandle *)local_a0,local_a4,local_a8,
                (Transform *)
                local_78[2].
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                .bits,alloc);
  if ((ParsedParameter *)local_60._0_8_ != (ParsedParameter *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return (GeneralMedium<pbrt::NanoVDBMediumProvider> *)CONCAT44(extraout_var_01,iVar4);
}

Assistant:

static GeneralMedium<DensityProvider> *Create(const DensityProvider *provider,
                                                  const ParameterDictionary &parameters,
                                                  const Transform &renderFromMedium,
                                                  const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(.0011f, .0024f, .014f));
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::General,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<RGBSpectrum>(*RGBColorSpace::sRGB,
                                                      RGB(2.55f, 3.21f, 3.77f));
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<GeneralMedium<DensityProvider>>(
            provider, sig_a, sig_s, sigScale, g, renderFromMedium, alloc);
    }